

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v7::detail::bigint::assign(bigint *this,uint64_t n)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    puVar1[uVar2] = (uint)n;
    uVar3 = uVar2 + 1;
    n = n >> 0x20;
  } while (n != 0);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ <= uVar2) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar3);
  }
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar2 < uVar3) {
    uVar3 = uVar2;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar3;
  this->exp_ = 0;
  return;
}

Assistant:

void assign(uint64_t n) {
    size_t num_bigits = 0;
    do {
      bigits_[num_bigits++] = n & ~bigit(0);
      n >>= bigit_bits;
    } while (n != 0);
    bigits_.resize(num_bigits);
    exp_ = 0;
  }